

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O2

shared_ptr<BER_CONTAINER> __thiscall StringCallback::buildTypeWithValue(StringCallback *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar2;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
  }
  else {
    std::make_shared<OctetType,char*&>((char **)&local_18);
    _Var1._M_pi = _Stack_10._M_pi;
    _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_ValueCallback)._vptr_ValueCallback = local_18;
    (this->super_ValueCallback).OID = (SortableOIDType *)_Var1._M_pi;
    local_18 = (_func_int **)0x0;
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> StringCallback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    return std::make_shared<OctetType>(*this->value);
}